

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::Value>(Serializer *this,vector<duckdb::Value,_true> *vec)

{
  pointer pVVar1;
  Value *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6);
  pVVar1 = (vec->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (vec->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pVVar1; this_00 = this_00 + 1) {
    (*this->_vptr_Serializer[6])(this);
    Value::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}